

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O0

void __thiscall TasgridWrapper::outputQuadrature(TasgridWrapper *this)

{
  value_type vVar1;
  int iVar2;
  int new_num_strips;
  ulong uVar3;
  double *pdVar4;
  reference pvVar5;
  double *pdVar6;
  int local_94;
  undefined1 local_90 [4];
  int i;
  Data2D<double> combined;
  vector<double,_std::allocator<double>_> weights;
  undefined1 local_40 [8];
  Wrapper2D<double> points;
  vector<double,_std::allocator<double>_> pnts;
  int num_points;
  TasgridWrapper *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) || ((this->printCout & 1U) != 0)) {
    new_num_strips = TasGrid::TasmanianSparseGrid::getNumPoints(&this->grid);
    TasGrid::TasmanianSparseGrid::getPoints
              ((vector<double,_std::allocator<double>_> *)&points.data,&this->grid);
    iVar2 = this->num_dimensions;
    pdVar4 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)&points.data);
    TasGrid::Utils::Wrapper2D<double>::Wrapper2D((Wrapper2D<double> *)local_40,iVar2,pdVar4);
    TasGrid::TasmanianSparseGrid::getQuadratureWeights
              ((vector<double,_std::allocator<double>_> *)
               &combined.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&this->grid);
    TasGrid::Data2D<double>::Data2D<int,int>
              ((Data2D<double> *)local_90,this->num_dimensions + 1,new_num_strips);
    for (local_94 = 0; local_94 < new_num_strips; local_94 = local_94 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &combined.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_94);
      vVar1 = *pvVar5;
      pdVar4 = TasGrid::Data2D<double>::getStrip((Data2D<double> *)local_90,local_94);
      *pdVar4 = vVar1;
      pdVar4 = TasGrid::Utils::Wrapper2D<double>::getStrip((Wrapper2D<double> *)local_40,local_94);
      iVar2 = this->num_dimensions;
      pdVar6 = TasGrid::Data2D<double>::getStrip((Data2D<double> *)local_90,local_94);
      std::copy_n<double*,int,double*>(pdVar4,iVar2,pdVar6 + 1);
    }
    iVar2 = this->num_dimensions;
    pdVar4 = TasGrid::Data2D<double>::getStrip((Data2D<double> *)local_90,0);
    writeMatrix(this,&this->outfilename,new_num_strips,iVar2 + 1,pdVar4);
    iVar2 = this->num_dimensions;
    pdVar4 = TasGrid::Data2D<double>::getStrip((Data2D<double> *)local_90,0);
    printMatrix(this,new_num_strips,iVar2 + 1,pdVar4,false);
    TasGrid::Data2D<double>::~Data2D((Data2D<double> *)local_90);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               &combined.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    TasGrid::Utils::Wrapper2D<double>::~Wrapper2D((Wrapper2D<double> *)local_40);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&points.data);
  }
  return;
}

Assistant:

void TasgridWrapper::outputQuadrature() const{
    if (outfilename.empty() and not printCout) return;
    int num_points = grid.getNumPoints();
    auto pnts  = grid.getPoints();
    Utils::Wrapper2D<double> points(num_dimensions, pnts.data());
    auto weights = grid.getQuadratureWeights();
    Data2D<double> combined(num_dimensions + 1, num_points);
    for(int i=0; i<num_points; i++){
        combined.getStrip(i)[0] = weights[i];
        std::copy_n(points.getStrip(i), num_dimensions, &(combined.getStrip(i)[1]));
    }
    writeMatrix(outfilename, num_points, num_dimensions+1, combined.getStrip(0));
    printMatrix(num_points, num_dimensions+1, combined.getStrip(0));
}